

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_om1_length(tcv_t *tcv)

{
  byte bVar1;
  uint local_20;
  uchar length;
  tcv_t *tcv_local;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = 0xfffffffc;
  }
  else {
    bVar1 = *(char *)((long)tcv->data + 0x12) * '\n';
    if (bVar1 == 0) {
      local_20 = 0xfffffff7;
    }
    else {
      local_20 = (uint)bVar1;
    }
    tcv_local._4_4_ = local_20;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_om1_length(tcv_t *tcv)
{
	unsigned char length;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Normalize length to meters */
	length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_OM1_10M] * 10;

	return length == 0 ? TCV_ERR_OM1_LENGTH_NOT_DEFINED : length;
}